

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

locale * anon_unknown.dwarf_f716::path_locale(void)

{
  int iVar1;
  
  if ((anonymous_namespace)::path_locale()::loc == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::path_locale()::loc);
    if (iVar1 != 0) {
      default_locale();
      __cxa_atexit(std::locale::~locale,&(anonymous_namespace)::path_locale()::loc,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::path_locale()::loc);
    }
  }
  return (locale *)&(anonymous_namespace)::path_locale()::loc;
}

Assistant:

std::locale& path_locale()
  // std::locale("") construction, needed on non-Apple POSIX systems, can throw
  // (if environmental variables LC_MESSAGES or LANG are wrong, for example), so
  // path_locale() provides lazy initialization via a local static to ensure that any 
  // exceptions occur after main() starts and so can be caught. Furthermore,
  // path_locale() is only called if path::codecvt() or path::imbue() are themselves
  // actually called, ensuring that an exception will only be thrown if std::locale("")
  // is really needed.
  {
    // [locale] paragraph 6: Once a facet reference is obtained from a locale object by
    // calling use_facet<>, that reference remains usable, and the results from member
    // functions of it may be cached and re-used, as long as some locale object refers
    // to that facet.
    static std::locale loc(default_locale());
#ifdef BOOST_FILESYSTEM_DEBUG
    std::cout << "***** path_locale() called" << std::endl;
#endif
    return loc;
  }